

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
TypedExpectation(TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                 *this,FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                       *owner,char *a_file,int a_line,string *a_source_text,ArgumentMatcherTuple *m)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  MatcherInterface<const_std::tuple<const_ot::commissioner::SecurityPolicy_&>_&> *__p;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002ded88;
  this->owner_ = owner;
  (this->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>_>.
  super__Head_base<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>,_false>.
  _M_head_impl.super_MatcherBase<const_ot::commissioner::SecurityPolicy_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002dcaa8;
  (this->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>_>.
  super__Head_base<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>,_false>.
  _M_head_impl.super_MatcherBase<const_ot::commissioner::SecurityPolicy_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (m->super__Tuple_impl<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>_>)
            .
            super__Head_base<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>,_false>
            ._M_head_impl.super_MatcherBase<const_ot::commissioner::SecurityPolicy_&>.impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (m->super__Tuple_impl<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>_>).
           super__Head_base<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>,_false>.
           _M_head_impl.super_MatcherBase<const_ot::commissioner::SecurityPolicy_&>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this->matchers_).
          super__Tuple_impl<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>_>.
          super__Head_base<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>,_false>.
          _M_head_impl.super_MatcherBase<const_ot::commissioner::SecurityPolicy_&>.impl_.
          super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
  + 8))->_M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->matchers_).
  super__Tuple_impl<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>_>.
  super__Head_base<0UL,_testing::Matcher<const_ot::commissioner::SecurityPolicy_&>,_false>.
  _M_head_impl.super_MatcherBase<const_ot::commissioner::SecurityPolicy_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002dca60;
  __p = (MatcherInterface<const_std::tuple<const_ot::commissioner::SecurityPolicy_&>_&> *)
        operator_new(8);
  (__p->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_002dedd0;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<const_ot::commissioner::SecurityPolicy_&>_&>._vptr_MatcherBase
       = (_func_int **)&PTR__MatcherBase_002dca30;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<const_ot::commissioner::SecurityPolicy_&>_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::tuple<const_ot::commissioner::SecurityPolicy_&>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<std::tuple<ot::commissioner::SecurityPolicy_const&>const&>const*>
            (&(this->extra_matcher_).
              super_MatcherBase<const_std::tuple<const_ot::commissioner::SecurityPolicy_&>_&>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_std::tuple<const_ot::commissioner::SecurityPolicy_&>_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<const_ot::commissioner::SecurityPolicy_&>_&>._vptr_MatcherBase
       = (_func_int **)&PTR__MatcherBase_002dee38;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}